

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall QString::append(QString *this,QUtf8StringView str)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  storage_type *psVar3;
  DataPointer *d;
  storage_type *psVar4;
  QLatin1StringView other;
  QByteArrayView in;
  
  pcVar1 = (char16_t *)str.m_size;
  psVar4 = str.m_data;
  if ((long)pcVar1 < 1 || psVar4 == (storage_type *)0x0) {
    if ((psVar4 != (storage_type *)0x0) && ((this->d).ptr == (char16_t *)0x0)) {
      qVar2 = QtPrivate::lengthHelperPointer<char>("");
      other.m_size = qVar2;
      other.m_data = "";
      operator=(this,other);
    }
  }
  else {
    psVar3 = (storage_type *)0x0;
    QArrayDataPointer<char16_t>::detachAndGrow
              (&this->d,GrowsAtEnd,(qsizetype)pcVar1,(char16_t **)0x0,
               (QArrayDataPointer<char16_t> *)0x0);
    in.m_data = psVar3;
    in.m_size = (qsizetype)psVar4;
    pcVar1 = QUtf8::convertToUnicode((QUtf8 *)((this->d).ptr + (this->d).size),pcVar1,in);
    resize(this,(long)pcVar1 - (long)(this->d).ptr >> 1);
  }
  return this;
}

Assistant:

QString &QString::append(QUtf8StringView str)
{
    append_helper(*this, str);
    return *this;
}